

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.cpp
# Opt level: O1

string * fs_get_cwd_abi_cxx11_(void)

{
  string *in_RDI;
  string_view in;
  path s;
  error_code ec;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  path local_48;
  int local_20;
  undefined8 local_18;
  
  local_20 = 0;
  local_18 = std::_V2::system_category();
  std::filesystem::current_path_abi_cxx11_((error_code *)&local_48);
  if (local_20 == 0) {
    std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
              (&local_68,&local_48,&local_69);
    in._M_str = local_68._M_dataplus._M_p;
    in._M_len = local_68._M_string_length;
    fs_drop_slash_abi_cxx11_(in_RDI,in);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_48);
  }
  else {
    fs_get_cwd_abi_cxx11_();
  }
  return in_RDI;
}

Assistant:

std::string fs_get_cwd()
{
  // does not have trailing slash
  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  if(auto s = std::filesystem::current_path(ec); !ec) FFS_LIKELY
    return fs_drop_slash(s.generic_string());
#elif defined(_WIN32)
// windows.h https://learn.microsoft.com/en-us/windows/win32/api/winbase/nf-winbase-getcurrentdirectory
  if(DWORD L = GetCurrentDirectoryA(0, nullptr); L > 0)  FFS_LIKELY
  {
    std::string r(L, '\0');
    if(GetCurrentDirectoryA(L, r.data()) == L-1)  FFS_LIKELY
    {
      r.resize(L-1);
      return fs_as_posix(r);
    }
  }
#else
// unistd.h https://www.man7.org/linux/man-pages/man3/getcwd.3.html
  if(std::string buf(fs_get_max_path(), '\0');
      getcwd(buf.data(), buf.size()))  FFS_LIKELY
    return fs_drop_slash(fs_trim(buf));
#endif

  fs_print_error("", __func__, ec);
  return {};
}